

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

int mbedtls_aes_setkey_dec(mbedtls_aes_context *ctx,uchar *key,uint keybits)

{
  uint uVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  int local_160;
  int local_15c;
  int j;
  int i;
  uint32_t *RK;
  mbedtls_aes_context cty;
  mbedtls_aes_context *pmStack_28;
  int ret;
  uint32_t *SK;
  uint keybits_local;
  uchar *key_local;
  mbedtls_aes_context *ctx_local;
  
  mbedtls_aes_init((mbedtls_aes_context *)&RK);
  uVar1 = mbedtls_aes_rk_offset(ctx->buf);
  ctx->rk_offset = (ulong)uVar1;
  puVar2 = ctx->buf + ctx->rk_offset;
  cty.buf[0x43] = mbedtls_aes_setkey_enc((mbedtls_aes_context *)&RK,key,keybits);
  if (cty.buf[0x43] == 0) {
    ctx->nr = (int)RK;
    puVar3 = cty.buf + cty._0_8_ + (long)((int)RK << 2) + -2;
    *puVar2 = *puVar3;
    puVar2[1] = puVar3[1];
    puVar2[2] = puVar3[2];
    _j = puVar2 + 4;
    puVar2[3] = puVar3[3];
    pmStack_28 = (mbedtls_aes_context *)(puVar3 + -4);
    local_15c = ctx->nr;
    while (local_15c = local_15c + -1, 0 < local_15c) {
      for (local_160 = 0; local_160 < 4; local_160 = local_160 + 1) {
        *_j = RT0[FSb[pmStack_28->nr & 0xff]] ^ RT1[FSb[(uint)pmStack_28->nr >> 8 & 0xff]] ^
              RT2[FSb[(uint)pmStack_28->nr >> 0x10 & 0xff]] ^ RT3[FSb[(uint)pmStack_28->nr >> 0x18]]
        ;
        pmStack_28 = (mbedtls_aes_context *)&pmStack_28->field_0x4;
        _j = _j + 1;
      }
      pmStack_28 = (mbedtls_aes_context *)(pmStack_28[-1].buf + 0x3c);
    }
    *_j = pmStack_28->nr;
    _j[1] = *(uint *)&pmStack_28->field_0x4;
    _j[2] = (uint)pmStack_28->rk_offset;
    _j[3] = *(uint *)((long)&pmStack_28->rk_offset + 4);
  }
  mbedtls_aes_free((mbedtls_aes_context *)&RK);
  return cty.buf[0x43];
}

Assistant:

int mbedtls_aes_setkey_dec(mbedtls_aes_context *ctx, const unsigned char *key,
                           unsigned int keybits)
{
#if !defined(MBEDTLS_AES_USE_HARDWARE_ONLY)
    uint32_t *SK;
#endif
    int ret;
    mbedtls_aes_context cty;
    uint32_t *RK;


    mbedtls_aes_init(&cty);

    ctx->rk_offset = mbedtls_aes_rk_offset(ctx->buf);
    RK = ctx->buf + ctx->rk_offset;

    /* Also checks keybits */
    if ((ret = mbedtls_aes_setkey_enc(&cty, key, keybits)) != 0) {
        goto exit;
    }

    ctx->nr = cty.nr;

#if defined(MBEDTLS_AESNI_HAVE_CODE)
    if (mbedtls_aesni_has_support(MBEDTLS_AESNI_AES)) {
        mbedtls_aesni_inverse_key((unsigned char *) RK,
                                  (const unsigned char *) (cty.buf + cty.rk_offset), ctx->nr);
        goto exit;
    }
#endif

#if defined(MBEDTLS_AESCE_HAVE_CODE)
    if (MBEDTLS_AESCE_HAS_SUPPORT()) {
        mbedtls_aesce_inverse_key(
            (unsigned char *) RK,
            (const unsigned char *) (cty.buf + cty.rk_offset),
            ctx->nr);
        goto exit;
    }
#endif

#if !defined(MBEDTLS_AES_USE_HARDWARE_ONLY)
    SK = cty.buf + cty.rk_offset + cty.nr * 4;

    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    SK -= 8;
    for (int i = ctx->nr - 1; i > 0; i--, SK -= 8) {
        for (int j = 0; j < 4; j++, SK++) {
            *RK++ = AES_RT0(FSb[MBEDTLS_BYTE_0(*SK)]) ^
                    AES_RT1(FSb[MBEDTLS_BYTE_1(*SK)]) ^
                    AES_RT2(FSb[MBEDTLS_BYTE_2(*SK)]) ^
                    AES_RT3(FSb[MBEDTLS_BYTE_3(*SK)]);
        }
    }

    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
#endif /* !MBEDTLS_AES_USE_HARDWARE_ONLY */
exit:
    mbedtls_aes_free(&cty);

    return ret;
}